

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRandomShaderTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::anon_unknown_1::ScalarConversionGroup::init
          (ScalarConversionGroup *this,EVP_PKEY_CTX *ctx)

{
  TestNode *node;
  TestNode *node_00;
  TestNode *node_01;
  ulong extraout_RAX;
  RandomShaderCase *pRVar1;
  ulong uVar2;
  deUint32 local_a4;
  int seed;
  TestCaseGroup *combinedGroup;
  TestCaseGroup *fragmentGroup;
  TestCaseGroup *vertexGroup;
  ProgramParameters params;
  ScalarConversionGroup *this_local;
  
  params._96_8_ = this;
  rsg::ProgramParameters::ProgramParameters((ProgramParameters *)&vertexGroup);
  params.fragmentParameters.maxSamplers._1_1_ = 1;
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"vertex",
             "Vertex-only tests");
  tcu::TestNode::addChild((TestNode *)this,node);
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"fragment",
             "Fragment-only tests");
  tcu::TestNode::addChild((TestNode *)this,node_00);
  node_01 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_01,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"combined",
             "Combined tests");
  tcu::TestNode::addChild((TestNode *)this,node_01);
  local_a4 = 0;
  uVar2 = extraout_RAX;
  while ((int)local_a4 < 100) {
    pRVar1 = createRandomShaderCase
                       ((this->super_TestCaseGroup).m_context,"Scalar conversions in vertex shader",
                        (ProgramParameters *)&vertexGroup,local_a4,true,false);
    tcu::TestNode::addChild(node,(TestNode *)pRVar1);
    pRVar1 = createRandomShaderCase
                       ((this->super_TestCaseGroup).m_context,
                        "Scalar conversions in fragment shader",(ProgramParameters *)&vertexGroup,
                        local_a4,false,true);
    tcu::TestNode::addChild(node_00,(TestNode *)pRVar1);
    pRVar1 = createRandomShaderCase
                       ((this->super_TestCaseGroup).m_context,
                        "Scalar conversions in vertex and fragment shaders",
                        (ProgramParameters *)&vertexGroup,local_a4,true,true);
    tcu::TestNode::addChild(node_01,(TestNode *)pRVar1);
    local_a4 = local_a4 + 1;
    uVar2 = (ulong)local_a4;
  }
  return (int)uVar2;
}

Assistant:

void init (void)
	{
		rsg::ProgramParameters params;
		params.useScalarConversions = true;

		tcu::TestCaseGroup* vertexGroup = new tcu::TestCaseGroup(m_testCtx, "vertex", "Vertex-only tests");
		addChild(vertexGroup);

		tcu::TestCaseGroup* fragmentGroup = new tcu::TestCaseGroup(m_testCtx, "fragment", "Fragment-only tests");
		addChild(fragmentGroup);

		tcu::TestCaseGroup* combinedGroup = new tcu::TestCaseGroup(m_testCtx, "combined", "Combined tests");
		addChild(combinedGroup);

		for (int seed = 0; seed < 100; seed++)
		{
			vertexGroup->addChild(createRandomShaderCase(m_context,		"Scalar conversions in vertex shader",					params, seed, true, false));
			fragmentGroup->addChild(createRandomShaderCase(m_context,	"Scalar conversions in fragment shader",				params, seed, false, true));
			combinedGroup->addChild(createRandomShaderCase(m_context,	"Scalar conversions in vertex and fragment shaders",	params, seed, true, true));
		}
	}